

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O1

void __thiscall
chrono::utils::ChAbsorbed_Power_Vertical::Config(ChAbsorbed_Power_Vertical *this,double step)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  auVar7._8_56_ = in_register_00001208;
  auVar7._0_8_ = step;
  this->m_Ts = step;
  auVar6 = auVar7._0_16_;
  auVar5 = vfmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar6,ZEXT816(0x4036000000000000));
  auVar3 = vfmadd213sd_fma(ZEXT816(0x4036000000000000),auVar6,ZEXT816(0xbff0000000000000));
  auVar4 = vfmadd213sd_fma(ZEXT816(0x404f800000000000),auVar6,ZEXT816(0x4000000000000000));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = step * 375.0;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = step * 24.0;
  auVar10 = vfmadd231sd_fma(auVar10,auVar9,auVar6);
  dVar1 = auVar10._0_8_ + 2.0;
  dVar2 = dVar1 * auVar4._0_8_;
  auVar10 = vfmadd213sd_fma(ZEXT816(0x404f800000000000),auVar6,ZEXT816(0xc000000000000000));
  auVar13._8_8_ = 0;
  auVar13._0_8_ = step * 750.0;
  auVar13 = vfmadd213sd_fma(auVar13,auVar6,ZEXT816(0xc010000000000000));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar13._0_8_ * auVar4._0_8_;
  auVar11 = vfmadd231sd_fma(auVar14,auVar10,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = step * -24.0;
  auVar6 = vfmadd231sd_fma(auVar12,auVar9,auVar6);
  dVar1 = auVar6._0_8_ + 2.0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = auVar13._0_8_ * auVar10._0_8_;
  auVar4 = vfmadd231sd_fma(auVar8,auVar6,auVar4);
  this->m_b0 = (step * 29.0 * auVar5._0_8_) / dVar2;
  this->m_b1 = (step * 29.0 * auVar3._0_8_) / dVar2;
  this->m_b2 = (step * -29.0 * auVar5._0_8_) / dVar2;
  this->m_b3 = (step * -29.0 * auVar3._0_8_) / dVar2;
  this->m_a1 = auVar11._0_8_ / dVar2;
  this->m_a2 = auVar4._0_8_ / dVar2;
  this->m_a3 = (auVar10._0_8_ * dVar1) / dVar2;
  this->m_a0 = 1.0;
  this->m_u_hist1 = 0.0;
  this->m_u_hist2 = 0.0;
  this->m_u_hist3 = 0.0;
  this->m_y_hist1 = 0.0;
  this->m_u_hist3 = 0.0;
  this->m_y_hist1 = 0.0;
  this->m_y_hist2 = 0.0;
  this->m_y_hist3 = 0.0;
  return;
}

Assistant:

void ChAbsorbed_Power_Vertical::Config(double step) {
    m_Ts = step;

    m_b0 = (29.0 * m_Ts * (22.0 * m_Ts + 1.0));
    m_b1 = (29.0 * m_Ts * (22.0 * m_Ts - 1.0));
    m_b2 = (-29.0 * m_Ts * (22.0 * m_Ts + 1.0));
    m_b3 = -29.0 * m_Ts * (22.0 * m_Ts - 1.0);

    m_a0 = ((63.0 * m_Ts + 2.0) * (375.0 * m_Ts * m_Ts + 24.0 * m_Ts + 2.0));
    m_a1 = ((63.0 * m_Ts - 2.0) * (375.0 * m_Ts * m_Ts + 24.0 * m_Ts + 2.0) +
            (63.0 * m_Ts + 2.0) * (750.0 * m_Ts * m_Ts - 4.0));
    m_a2 = ((63.0 * m_Ts + 2.0) * (375.0 * m_Ts * m_Ts - 24.0 * m_Ts + 2.0) +
            (63.0 * m_Ts - 2.0) * (750.0 * m_Ts * m_Ts - 4.0));
    m_a3 = (63.0 * m_Ts - 2.0) * (375.0 * m_Ts * m_Ts - 24.0 * m_Ts + 2.0);

    m_b0 /= m_a0;
    m_b1 /= m_a0;
    m_b2 /= m_a0;
    m_b3 /= m_a0;

    m_a1 /= m_a0;
    m_a2 /= m_a0;
    m_a3 /= m_a0;
    m_a0 = 1.0;

    Reset();
}